

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

float * __thiscall
google::protobuf::RepeatedField<float>::AddNAlreadyReserved(RepeatedField<float> *this,int n)

{
  int iVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = this->current_size_;
  if (this->total_size_ - iVar1 < n) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x268);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (total_size_ - current_size_) >= (n): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,this->total_size_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,", ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,this->current_size_);
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
    iVar1 = this->current_size_;
  }
  this->current_size_ = iVar1 + n;
  return (float *)((long)iVar1 * 4 + (long)this->arena_or_elements_);
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n) {
  GOOGLE_DCHECK_GE(total_size_ - current_size_, n)
      << total_size_ << ", " << current_size_;
  // Warning: sometimes people call this when n == 0 and total_size_ == 0. In
  // this case the return pointer points to a zero size array (n == 0). Hence
  // we can just use unsafe_elements(), because the user cannot dereference the
  // pointer anyway.
  Element* ret = unsafe_elements() + current_size_;
  current_size_ += n;
  return ret;
}